

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O0

int __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::listen
          (endpoint<websocketpp::config::asio::transport_config> *this,int __fd,int __n)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  element_type *peVar2;
  endpoint<websocketpp::config::asio::transport_config> *peVar3;
  socklen_t __len;
  size_t in_RCX;
  undefined4 in_register_00000014;
  error_category *peVar4;
  undefined4 in_register_00000034;
  error_code eVar5;
  error_code eVar6;
  error_code bec;
  basic_endpoint<asio::ip::tcp> *in_stack_fffffffffffffea8;
  error_code *in_stack_fffffffffffffeb0;
  shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_> *__args;
  function<std::error_code_(std::shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_>)>
  *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  endpoint<websocketpp::config::asio::transport_config> *in_stack_fffffffffffffed0;
  endpoint<websocketpp::config::asio::transport_config> *this_02;
  undefined8 local_118;
  error_category *local_110;
  undefined4 uStack_104;
  undefined4 uStack_e4;
  undefined4 uStack_c4;
  shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_> local_a8;
  int local_98;
  undefined4 uStack_94;
  error_category *local_90;
  undefined4 uStack_84;
  int local_78;
  error_category *local_70;
  boolean<1,_2> local_64 [2];
  undefined4 uStack_5c;
  int local_50;
  int local_3c;
  error_code local_38;
  undefined4 uStack_24;
  error_code *local_18;
  undefined8 local_10;
  endpoint<websocketpp::config::asio::transport_config> *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_18 = (error_code *)CONCAT44(in_register_00000014,__n);
  local_8 = this;
  if (this->m_state == READY) {
    this_01 = std::
              __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2e3de8);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_01,0x400,"asio::listen",in_RCX);
    std::error_code::error_code(in_stack_fffffffffffffeb0);
    peVar2 = std::
             __shared_ptr_access<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2e3e1a);
    local_3c = (int)::asio::ip::basic_endpoint<asio::ip::tcp>::protocol(in_stack_fffffffffffffea8);
    local_50 = ::asio::basic_socket_acceptor<asio::ip::tcp>::open
                         (peVar2,(char *)&local_3c,(int)&local_38);
    bVar1 = std::error_code::operator_cast_to_bool(&local_38);
    if (bVar1) {
      eVar5 = clean_up_listen_after_error<std::error_code>
                        (in_stack_fffffffffffffed0,
                         (error_code *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                        );
      *(ulong *)local_18 = CONCAT44(uStack_5c,eVar5._M_value);
      local_18->_M_cat = eVar5._M_cat;
    }
    else {
      peVar3 = (endpoint<websocketpp::config::asio::transport_config> *)
               std::
               __shared_ptr_access<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2e3ec5);
      this_02 = peVar3;
      ::asio::detail::socket_option::boolean<1,_2>::boolean(local_64,(bool)(this->m_reuse_addr & 1))
      ;
      __len = (socklen_t)peVar3;
      eVar6 = ::asio::basic_socket_acceptor<asio::ip::tcp>::
              set_option<asio::detail::socket_option::boolean<1,2>>
                        (peVar2,(boolean<1,_2> *)this_02,
                         (error_code *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                        );
      local_70 = eVar6._M_cat;
      local_78 = eVar6._M_value;
      bVar1 = std::error_code::operator_cast_to_bool(&local_38);
      if (bVar1) {
        eVar5 = clean_up_listen_after_error<std::error_code>
                          (this_02,(error_code *)
                                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        *(ulong *)local_18 = CONCAT44(uStack_84,eVar5._M_value);
        local_18->_M_cat = eVar5._M_cat;
      }
      else {
        bVar1 = std::function::operator_cast_to_bool
                          ((function<std::error_code_(std::shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_>)>
                            *)0x2e3f79);
        if (bVar1) {
          in_stack_fffffffffffffeb0 = (error_code *)&this->m_tcp_pre_bind_handler;
          __args = &local_a8;
          std::shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_>::shared_ptr
                    ((shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_> *)
                     in_stack_fffffffffffffeb0,
                     (shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_> *)
                     in_stack_fffffffffffffea8);
          eVar5 = std::
                  function<std::error_code_(std::shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_>)>
                  ::operator()(in_stack_fffffffffffffec0,__args);
          peVar4 = eVar5._M_cat;
          in_stack_fffffffffffffecc = eVar5._M_value;
          *(ulong *)local_18 = CONCAT44(uStack_94,in_stack_fffffffffffffecc);
          local_18->_M_cat = peVar4;
          local_98 = in_stack_fffffffffffffecc;
          local_90 = peVar4;
          std::shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_>::~shared_ptr
                    ((shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_> *)0x2e400a);
          __len = (socklen_t)peVar4;
          bVar1 = std::error_code::operator_cast_to_bool(local_18);
          if (bVar1) {
            eVar5 = clean_up_listen_after_error<std::error_code>
                              (this_02,(error_code *)
                                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                              );
            *(ulong *)local_18 = CONCAT44(uStack_c4,eVar5._M_value);
            local_18->_M_cat = eVar5._M_cat;
            goto LAB_002e41be;
          }
        }
        peVar2 = std::
                 __shared_ptr_access<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2e409b);
        ::asio::basic_socket_acceptor<asio::ip::tcp>::bind
                  (peVar2,(int)local_10,(sockaddr *)&local_38,__len);
        bVar1 = std::error_code::operator_cast_to_bool(&local_38);
        if (bVar1) {
          eVar5 = clean_up_listen_after_error<std::error_code>
                            (this_02,(error_code *)
                                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          *(ulong *)local_18 = CONCAT44(uStack_e4,eVar5._M_value);
          local_18->_M_cat = eVar5._M_cat;
        }
        else {
          peVar2 = std::
                   __shared_ptr_access<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2e411f);
          ::asio::basic_socket_acceptor<asio::ip::tcp>::listen
                    (peVar2,this->m_listen_backlog,(int)&local_38);
          bVar1 = std::error_code::operator_cast_to_bool(&local_38);
          if (bVar1) {
            eVar5 = clean_up_listen_after_error<std::error_code>
                              (this_02,(error_code *)
                                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                              );
            *(ulong *)local_18 = CONCAT44(uStack_104,eVar5._M_value);
            local_18->_M_cat = eVar5._M_cat;
          }
          else {
            this->m_state = LISTENING;
            std::error_code::error_code(in_stack_fffffffffffffeb0);
            *(undefined8 *)local_18 = local_118;
            local_18->_M_cat = local_110;
          }
        }
      }
    }
  }
  else {
    this_00 = std::
              __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2e3d86);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              (this_00,2,"asio::listen called from the wrong state",in_RCX);
    eVar5 = websocketpp::error::make_error_code(0);
    *(ulong *)local_18 = CONCAT44(uStack_24,eVar5._M_value);
    local_18->_M_cat = eVar5._M_cat;
  }
LAB_002e41be:
  return (int)local_18;
}

Assistant:

void listen(lib::asio::ip::tcp::endpoint const & ep, lib::error_code & ec)
    {
        if (m_state != READY) {
            m_elog->write(log::elevel::library,
                "asio::listen called from the wrong state");
            using websocketpp::error::make_error_code;
            ec = make_error_code(websocketpp::error::invalid_state);
            return;
        }

        m_alog->write(log::alevel::devel,"asio::listen");

        lib::asio::error_code bec;

        m_acceptor->open(ep.protocol(),bec);
        if (bec) {ec = clean_up_listen_after_error(bec);return;}
        
        m_acceptor->set_option(lib::asio::socket_base::reuse_address(m_reuse_addr),bec);
        if (bec) {ec = clean_up_listen_after_error(bec);return;}
        
        // if a TCP pre-bind handler is present, run it
        if (m_tcp_pre_bind_handler) {
            ec = m_tcp_pre_bind_handler(m_acceptor);
            if (ec) {
                ec = clean_up_listen_after_error(ec);
                return;
            }
        }
        
        m_acceptor->bind(ep,bec);
        if (bec) {ec = clean_up_listen_after_error(bec);return;}
        
        m_acceptor->listen(m_listen_backlog,bec);
        if (bec) {ec = clean_up_listen_after_error(bec);return;}
        
        // Success
        m_state = LISTENING;
        ec = lib::error_code();
    }